

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O1

void __thiscall
TPZTransfer<std::complex<float>_>::TPZTransfer
          (TPZTransfer<std::complex<float>_> *this,TPZBlock *row,TPZBlock *col,int nvar,
          int nrowblocks,int ncolblocks)

{
  long lVar1;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = 0;
  *(undefined8 *)((long)&(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow + 2)
       = 0;
  *(undefined8 *)((long)&(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol + 2)
       = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZTransfer_01855810;
  *(int *)&(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.field_0x1c = nvar;
  (this->fRowBlock).super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZBlock_01897e10;
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore = (TNode *)0x0;
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements = 0;
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc = 0;
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01857538;
  lVar1 = 0x54;
  do {
    *(undefined ***)((long)(this->fRowBlock).fBlock.fExtAlloc + lVar1 + -0x54) =
         &PTR__TNode_01897ef8;
    *(undefined8 *)((long)(this->fRowBlock).fBlock.fExtAlloc + lVar1 + -0x4c) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xf4);
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore = (this->fRowBlock).fBlock.fExtAlloc
  ;
  (this->fRowBlock).fpMatrix = (TPZBaseMatrix *)0x0;
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements = 0;
  (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc = 0;
  (this->fColBlock).super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZBlock_01897e10;
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore = (TNode *)0x0;
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements = 0;
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc = 0;
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01857538;
  lVar1 = 0x124;
  do {
    *(undefined ***)((long)(this->fRowBlock).fBlock.fExtAlloc + lVar1 + -0x54) =
         &PTR__TNode_01897ef8;
    *(undefined8 *)((long)(this->fRowBlock).fBlock.fExtAlloc + lVar1 + -0x4c) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x1c4);
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore = (this->fColBlock).fBlock.fExtAlloc
  ;
  (this->fColBlock).fpMatrix = (TPZBaseMatrix *)0x0;
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNElements = 0;
  (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fNAlloc = 0;
  (this->fColPosition)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  (this->fColPosition).fStore = (int *)0x0;
  (this->fColPosition).fNElements = 0;
  (this->fColPosition).fNAlloc = 0;
  (this->fNumberofColumnBlocks)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  (this->fNumberofColumnBlocks).fStore = (int *)0x0;
  (this->fNumberofColumnBlocks).fNElements = 0;
  (this->fNumberofColumnBlocks).fNAlloc = 0;
  TPZManVector<int,_10>::TPZManVector(&this->fColumnBlockPosition,0);
  TPZManVector<int,_10>::TPZManVector(&this->fColumnBlockNumber,0);
  this->fColumnBlockLastUsed = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore = (complex<float> *)0x0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNElements = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNAlloc = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_018423d8;
  (this->fDoubleValues).fExtAlloc[0]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[1]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[2]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[3]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[4]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[5]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[6]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[7]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[8]._M_value = 0;
  (this->fDoubleValues).fExtAlloc[9]._M_value = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fStore = (this->fDoubleValues).fExtAlloc;
  this->fDoubleValLastUsed = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNElements = 0;
  (this->fDoubleValues).super_TPZVec<std::complex<float>_>.fNAlloc = 0;
  SetBlocks(this,row,col,nvar,nrowblocks,ncolblocks);
  return;
}

Assistant:

TPZTransfer<TVar>::TPZTransfer(TPZBlock &row, TPZBlock &col,int nvar, int nrowblocks, int ncolblocks) :
                                                        TPZRegisterClassId(&TPZTransfer::ClassId),
                                                        TPZMatrix<TVar>(), fNTVarVar(nvar), fRowBlock(), fColBlock(),
                                                        fColPosition(), fNumberofColumnBlocks(),
                                                        fColumnBlockPosition(0),fColumnBlockNumber(0),
                                                        fColumnBlockLastUsed(0),fDoubleValues(0),fDoubleValLastUsed(0)
{
	SetBlocks(row,col,nvar,nrowblocks,ncolblocks);
}